

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugi.cpp
# Opt level: O3

void NULLCPugiXML::xml_document__save
               (NULLCFuncPtr writer,NULLCArray indent,int flags,xml_encoding encoding,
               xml_document *document)

{
  xml_document *this;
  char *error;
  xml_writer local_18;
  void *local_10;
  uint local_8;
  
  local_8 = writer.id;
  local_10 = writer.context;
  if (document->impl == (xml_document_impl *)0x0) {
    error = "xml_document constructor wasn\'t called";
  }
  else {
    this = document->impl->document;
    if (this != (xml_document *)0x0) {
      local_18._vptr_xml_writer = (_func_int **)&PTR__xml_writer_003e8270;
      pugi::xml_document::save(this,&local_18,indent.ptr,flags,encoding);
      return;
    }
    error = "xml_document::save document is empty, you must create document first";
  }
  nullcThrowError(error,CONCAT44((int)((ulong)register0x00000030 >> 0x20),local_8),indent.ptr,
                  CONCAT44((int)((ulong)register0x00000008 >> 0x20),indent.len));
  return;
}

Assistant:

void xml_document__save(NULLCFuncPtr writer, NULLCArray indent, int flags, pugi::xml_encoding encoding, xml_document* document)
	{
		if(!document->impl){ nullcThrowError("xml_document constructor wasn't called"); return; }
		pugi::xml_document *doc = document->impl->document;
		if(!doc)
		{
			nullcThrowError("xml_document::save document is empty, you must create document first");
			return;
		}
		xml_writer_nullc writer_nullc = xml_writer_nullc(writer);
		doc->save(writer_nullc, indent.ptr, flags, encoding);
	}